

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O0

ostream * AixLog::operator<<(ostream *os,Severity *log_severity)

{
  long lVar1;
  char *in_RSI;
  ostream *in_RDI;
  Severity in_stack_000000df;
  lock_guard<std::recursive_mutex> lock;
  Log *log;
  Function *in_stack_fffffffffffffee8;
  ostream *poVar2;
  Function *in_stack_fffffffffffffef0;
  string *psVar3;
  long *local_100;
  string local_f0 [8];
  nullptr_t in_stack_ffffffffffffff18;
  Tag *in_stack_ffffffffffffff20;
  nullptr_t in_stack_ffffffffffffff28;
  Function *in_stack_ffffffffffffff30;
  Timestamp local_48 [2];
  long *local_18;
  char *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  lVar1 = std::ios::rdbuf();
  if (lVar1 == 0) {
    local_100 = (long *)0x0;
  }
  else {
    local_100 = (long *)__dynamic_cast(lVar1,&std::streambuf::typeinfo,&Log::typeinfo,0);
  }
  local_18 = local_100;
  if (local_100 == (long *)0x0) {
    psVar3 = local_f0;
    poVar2 = local_8;
    to_string_abi_cxx11_(in_stack_000000df);
    std::operator<<(poVar2,psVar3);
    std::__cxx11::string::~string(local_f0);
  }
  else {
    std::lock_guard<std::recursive_mutex>::lock_guard
              ((lock_guard<std::recursive_mutex> *)in_stack_fffffffffffffef0,
               (mutex_type *)in_stack_fffffffffffffee8);
    if ((char)local_18[0x10] != *local_10) {
      (**(code **)(*local_18 + 0x30))();
      *(char *)(local_18 + 0x10) = *local_10;
      Timestamp::Timestamp((Timestamp *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      Timestamp::operator=((Timestamp *)(local_18 + 0x22),local_48);
      Timestamp::~Timestamp(local_48);
      Tag::Tag(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      Tag::operator=((Tag *)in_stack_fffffffffffffef0,(Tag *)in_stack_fffffffffffffee8);
      Tag::~Tag((Tag *)0x2bd40f);
      Function::Function(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      Function::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      Function::~Function(in_stack_fffffffffffffef0);
      Conditional::set((Conditional *)(local_18 + 0x25),true);
    }
    std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x2bd4c7)
    ;
  }
  return local_8;
}

Assistant:

static std::ostream& operator<<(std::ostream& os,
                                const Severity& log_severity) {
  Log* log = dynamic_cast<Log*>(os.rdbuf());
  if (log != nullptr) {
    std::lock_guard<std::recursive_mutex> lock(log->mutex_);
    if (log->metadata_.severity != log_severity) {
      log->sync();
      log->metadata_.severity = log_severity;
      log->metadata_.timestamp = nullptr;
      log->metadata_.tag = nullptr;
      log->metadata_.function = nullptr;
      log->conditional_.set(true);
    }
  } else {
    os << to_string(log_severity);
  }
  return os;
}